

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O3

void btPolyhedralContactClipping::clipHullAgainstHull
               (btVector3 *separatingNormal1,btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,
               btTransform *transA,btTransform *transB,btScalar minDist,btScalar maxDist,
               Result *resultOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  btVector3 *pbVar13;
  btScalar *pbVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  btFace *pbVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  btVertexArray worldVertsB1;
  btVector3 separatingNormal;
  btVertexArray local_150;
  btScalar local_130;
  btScalar local_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 uStack_100;
  btConvexPolyhedron *local_f0;
  btTransform *local_e8;
  Result *local_e0;
  btFace *local_d8;
  btConvexPolyhedron *local_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  btVector3 local_40;
  
  local_40.m_floats[0] = (btScalar)*(undefined8 *)separatingNormal1->m_floats;
  local_40.m_floats[1] = (btScalar)((ulong)*(undefined8 *)separatingNormal1->m_floats >> 0x20);
  local_128._0_8_ = *(undefined8 *)(separatingNormal1->m_floats + 2);
  fVar23 = (float)local_128._0_8_;
  local_40.m_floats[3] = (btScalar)((ulong)local_128._0_8_ >> 0x20);
  fVar24 = 1.0 / SQRT(fVar23 * fVar23 +
                      local_40.m_floats[0] * local_40.m_floats[0] +
                      local_40.m_floats[1] * local_40.m_floats[1]);
  local_40.m_floats[0] = fVar24 * local_40.m_floats[0];
  local_40.m_floats[1] = fVar24 * local_40.m_floats[1];
  local_40.m_floats[2] = fVar23 * fVar24;
  uVar12 = (ulong)(hullB->m_faces).m_size;
  pbVar18 = (hullB->m_faces).m_data;
  if ((long)uVar12 < 1) {
    iVar20 = -1;
  }
  else {
    local_128._4_4_ = local_40.m_floats[3];
    local_128._0_4_ = fVar23 * fVar24;
    fVar3 = (transB->m_basis).m_el[0].m_floats[0];
    local_108 = CONCAT44(local_108._4_4_,fVar3);
    fVar4 = (transB->m_basis).m_el[0].m_floats[1];
    local_118._0_4_ = fVar4;
    pbVar14 = pbVar18->m_plane + 2;
    fVar25 = -3.4028235e+38;
    uVar21 = 0xffffffff;
    uVar17 = 0;
    do {
      fVar26 = pbVar14[-2];
      fVar5 = pbVar14[-1];
      fVar6 = *pbVar14;
      fVar26 = ((transB->m_basis).m_el[0].m_floats[2] * fVar6 + fVar3 * fVar26 + fVar5 * fVar4) *
               local_40.m_floats[0] +
               ((transB->m_basis).m_el[1].m_floats[2] * fVar6 +
               (transB->m_basis).m_el[1].m_floats[0] * fVar26 +
               fVar5 * (transB->m_basis).m_el[1].m_floats[1]) * local_40.m_floats[1] +
               (fVar6 * (transB->m_basis).m_el[2].m_floats[2] +
               fVar26 * (transB->m_basis).m_el[2].m_floats[0] +
               fVar5 * (transB->m_basis).m_el[2].m_floats[1]) * fVar23 * fVar24;
      if (fVar25 < fVar26) {
        uVar21 = uVar17 & 0xffffffff;
        fVar25 = fVar26;
      }
      iVar20 = (int)uVar21;
      uVar17 = uVar17 + 1;
      pbVar14 = pbVar14 + 0xc;
    } while (uVar12 != uVar17);
  }
  local_128._8_8_ = 0;
  uVar12 = 0;
  local_150.m_data = (btVector3 *)0x0;
  local_150.m_size = 0;
  local_150.m_capacity = 0;
  lVar22 = (long)pbVar18[iVar20].m_indices.m_size;
  local_130 = minDist;
  local_12c = maxDist;
  local_f0 = hullA;
  local_e8 = transA;
  local_e0 = resultOut;
  if (0 < lVar22) {
    pbVar18 = pbVar18 + iVar20;
    lVar19 = 0;
    local_d8 = pbVar18;
    local_d0 = hullB;
    do {
      local_150.m_ownsMemory = true;
      iVar7 = (pbVar18->m_indices).m_data[lVar19];
      pbVar13 = (hullB->m_vertices).m_data;
      local_78 = *(undefined8 *)(transB->m_basis).m_el[0].m_floats;
      uStack_70 = *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 2);
      local_b8 = *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 1);
      uStack_b0 = *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 3);
      local_108 = *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 2);
      uStack_100 = *(undefined8 *)(transB->m_basis).m_el[1].m_floats;
      local_a8 = ZEXT416((uint)pbVar13[iVar7].m_floats[1]);
      local_68 = ZEXT416((uint)pbVar13[iVar7].m_floats[0]);
      local_128 = ZEXT416((uint)pbVar13[iVar7].m_floats[2]);
      local_c8 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[1]);
      local_88 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]);
      local_58 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]);
      local_98 = *(undefined8 *)(transB->m_origin).m_floats;
      uStack_90 = 0;
      local_118 = ZEXT416((uint)((transB->m_basis).m_el[2].m_floats[2] * pbVar13[iVar7].m_floats[2]
                                 + (transB->m_basis).m_el[2].m_floats[0] *
                                   pbVar13[iVar7].m_floats[0] +
                                   (transB->m_basis).m_el[2].m_floats[1] *
                                   pbVar13[iVar7].m_floats[1] + (transB->m_origin).m_floats[2]));
      uVar11 = (uint)uVar12;
      pbVar13 = local_150.m_data;
      uVar10 = local_150.m_capacity;
      if (uVar11 == local_150.m_capacity) {
        uVar16 = uVar11 * 2;
        if (uVar11 == 0) {
          uVar16 = 1;
        }
        if ((int)uVar11 < (int)uVar16) {
          if (uVar16 == 0) {
            pbVar13 = (btVector3 *)0x0;
          }
          else {
            pbVar13 = (btVector3 *)btAlignedAllocInternal((long)(int)uVar16 << 4,0x10);
            uVar12 = (ulong)(uint)local_150.m_size;
          }
          uVar11 = (uint)uVar12;
          hullB = local_d0;
          pbVar18 = local_d8;
          uVar10 = uVar16;
          if ((int)uVar11 < 1) {
            if (local_150.m_data == (btVector3 *)0x0) goto LAB_0018428a;
          }
          else {
            lVar15 = 0;
            do {
              puVar1 = (undefined8 *)((long)(local_150.m_data)->m_floats + lVar15);
              uVar9 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar13->m_floats + lVar15);
              *puVar2 = *puVar1;
              puVar2[1] = uVar9;
              lVar15 = lVar15 + 0x10;
            } while (uVar12 << 4 != lVar15);
          }
          if (local_150.m_ownsMemory == true) {
            btAlignedFreeInternal(local_150.m_data);
            hullB = local_d0;
            pbVar18 = local_d8;
            uVar11 = local_150.m_size;
          }
        }
      }
LAB_0018428a:
      local_150.m_capacity = uVar10;
      local_150.m_data = pbVar13;
      auVar8._4_4_ = (float)local_58._0_4_ * (float)local_128._0_4_ +
                     (float)local_88._0_4_ * (float)local_68._0_4_ +
                     (float)local_c8._0_4_ * (float)local_a8._0_4_ + local_98._4_4_;
      auVar8._0_4_ = (float)local_108 * (float)local_128._0_4_ +
                     (float)local_78 * (float)local_68._0_4_ +
                     (float)local_b8 * (float)local_a8._0_4_ + (float)local_98;
      auVar8._8_4_ = local_118._0_4_;
      auVar8._12_4_ = 0;
      *(undefined1 (*) [16])local_150.m_data[(int)uVar11].m_floats = auVar8;
      local_150.m_size = local_150.m_size + 1;
      uVar12 = (ulong)(uint)local_150.m_size;
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar22);
  }
  local_150.m_ownsMemory = true;
  if (-1 < iVar20) {
    clipFaceAgainstHull(&local_40,local_f0,local_e8,&local_150,local_130,local_12c,local_e0);
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_150);
  return;
}

Assistant:

void	btPolyhedralContactClipping::clipHullAgainstHull(const btVector3& separatingNormal1, const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, const btScalar minDist, btScalar maxDist,btDiscreteCollisionDetectorInterface::Result& resultOut)
{

	btVector3 separatingNormal = separatingNormal1.normalized();
//	const btVector3 c0 = transA * hullA.m_localCenter;
//	const btVector3 c1 = transB * hullB.m_localCenter;
	//const btVector3 DeltaC2 = c0 - c1;



	int closestFaceB=-1;
	btScalar dmax = -FLT_MAX;
	{
		for(int face=0;face<hullB.m_faces.size();face++)
		{
			const btVector3 Normal(hullB.m_faces[face].m_plane[0], hullB.m_faces[face].m_plane[1], hullB.m_faces[face].m_plane[2]);
			const btVector3 WorldNormal = transB.getBasis() * Normal;
			btScalar d = WorldNormal.dot(separatingNormal);
			if (d > dmax)
			{
				dmax = d;
				closestFaceB = face;
			}
		}
	}
				btVertexArray worldVertsB1;
				{
					const btFace& polyB = hullB.m_faces[closestFaceB];
					const int numVertices = polyB.m_indices.size();
					for(int e0=0;e0<numVertices;e0++)
					{
						const btVector3& b = hullB.m_vertices[polyB.m_indices[e0]];
						worldVertsB1.push_back(transB*b);
					}
				}

	
	if (closestFaceB>=0)
		clipFaceAgainstHull(separatingNormal, hullA, transA,worldVertsB1, minDist, maxDist,resultOut);

}